

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cpp
# Opt level: O1

int __thiscall ncnn::Interp::forward(Interp *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float *pfVar1;
  size_t __size;
  float *pfVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  float fVar9;
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  Interp *pIVar14;
  int remain;
  int iVar15;
  int iVar16;
  int *xofs;
  long lVar17;
  int *piVar18;
  Interp *pIVar19;
  long lVar20;
  int *piVar21;
  Interp *pIVar22;
  Interp *pIVar23;
  undefined4 *puVar24;
  uint uVar25;
  float *rows2p;
  void *pvVar26;
  float *pfVar27;
  int iVar28;
  Interp *pIVar29;
  float *rows1p;
  Interp *pIVar30;
  float *rows1p_2;
  ulong uVar31;
  Interp *pIVar32;
  int iVar33;
  float *rows1p_1;
  ulong uVar34;
  uint _c;
  uint uVar35;
  float *rows3p_1;
  int *piVar36;
  uint uVar37;
  long lVar38;
  uint uVar39;
  size_t totalsize;
  Interp *pIVar40;
  float fVar41;
  undefined1 auVar42 [16];
  float fVar43;
  undefined1 auVar44 [16];
  int iVar46;
  undefined1 auVar45 [16];
  Interp *local_108;
  int *local_100;
  Interp *local_f8;
  Interp *local_f0;
  Interp *local_e8;
  Interp *local_e0;
  int *local_d8;
  Interp *local_d0;
  undefined1 *local_c8;
  float *local_c0;
  int *local_b8;
  int *local_b0;
  int *local_a8;
  float *local_a0;
  Interp *local_98;
  Interp *local_90;
  int *local_88;
  void *local_80;
  int *local_78;
  int *local_70;
  ulong local_68;
  undefined1 *local_60;
  ulong local_58;
  Mat *local_50;
  Mat *local_48;
  float *local_40;
  int *local_38;
  
  uVar39 = this->output_width;
  uVar37 = this->output_height;
  if (bottom_blob->dims == 1) {
    uVar25 = 1;
    uVar35 = 1;
    _c = bottom_blob->w;
  }
  else {
    uVar25 = bottom_blob->h;
    _c = bottom_blob->c;
    uVar35 = bottom_blob->w;
  }
  local_c8 = (undefined1 *)(ulong)uVar35;
  local_b0 = (int *)(ulong)uVar25;
  if (uVar39 == 0 || uVar37 == 0) {
    uVar37 = (uint)((float)(int)uVar25 * this->height_scale);
    uVar39 = (uint)((float)(int)uVar35 * this->width_scale);
  }
  if ((uVar37 == uVar25) && (uVar39 == uVar35)) {
    iVar15 = 0;
    if (top_blob != bottom_blob) {
      piVar36 = bottom_blob->refcount;
      if (piVar36 != (int *)0x0) {
        LOCK();
        *piVar36 = *piVar36 + 1;
        UNLOCK();
      }
      piVar36 = top_blob->refcount;
      if (piVar36 != (int *)0x0) {
        LOCK();
        *piVar36 = *piVar36 + -1;
        UNLOCK();
        if (*piVar36 == 0) {
          if (top_blob->allocator == (Allocator *)0x0) {
            if (top_blob->data != (void *)0x0) {
              free(top_blob->data);
            }
          }
          else {
            (**(code **)(*(long *)top_blob->allocator + 0x18))();
          }
        }
      }
      *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
      *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      top_blob->dims = 0;
      top_blob->w = 0;
      top_blob->h = 0;
      top_blob->c = 0;
      top_blob->cstep = 0;
      piVar36 = bottom_blob->refcount;
      top_blob->data = bottom_blob->data;
      top_blob->refcount = piVar36;
      top_blob->elemsize = bottom_blob->elemsize;
      top_blob->elempack = bottom_blob->elempack;
      top_blob->allocator = bottom_blob->allocator;
      iVar15 = bottom_blob->w;
      iVar46 = bottom_blob->h;
      iVar16 = bottom_blob->c;
      top_blob->dims = bottom_blob->dims;
      top_blob->w = iVar15;
      top_blob->h = iVar46;
      top_blob->c = iVar16;
      top_blob->cstep = bottom_blob->cstep;
      iVar15 = 0;
    }
  }
  else {
    local_e8 = this;
    Mat::create(top_blob,uVar39,uVar37,_c,bottom_blob->elemsize,opt->blob_allocator);
    auVar13 = _DAT_00176250;
    auVar12 = _DAT_00175020;
    auVar11 = _DAT_00175010;
    iVar15 = -100;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      if (bottom_blob->dims == 1) {
        if (0 < (int)_c) {
          sVar5 = top_blob->cstep;
          uVar39 = top_blob->h * top_blob->w;
          pvVar26 = bottom_blob->data;
          lVar20 = (ulong)uVar39 - 1;
          auVar42._8_4_ = (int)lVar20;
          auVar42._0_8_ = lVar20;
          auVar42._12_4_ = (int)((ulong)lVar20 >> 0x20);
          lVar20 = (long)top_blob->data + 0xc;
          sVar6 = top_blob->elemsize;
          uVar31 = 0;
          auVar42 = auVar42 ^ _DAT_00175020;
          do {
            if (0 < (int)uVar39) {
              uVar3 = *(undefined4 *)((long)pvVar26 + uVar31 * 4);
              uVar34 = 0;
              do {
                auVar44._8_4_ = (int)uVar34;
                auVar44._0_8_ = uVar34;
                auVar44._12_4_ = (int)(uVar34 >> 0x20);
                auVar45 = (auVar44 | auVar11) ^ auVar12;
                iVar15 = auVar42._4_4_;
                if ((bool)(~(iVar15 < auVar45._4_4_ ||
                            auVar42._0_4_ < auVar45._0_4_ && auVar45._4_4_ == iVar15) & 1)) {
                  *(undefined4 *)(lVar20 + -0xc + uVar34 * 4) = uVar3;
                }
                if (auVar45._12_4_ <= auVar42._12_4_ &&
                    (auVar45._8_4_ <= auVar42._8_4_ || auVar45._12_4_ != auVar42._12_4_)) {
                  *(undefined4 *)(lVar20 + -8 + uVar34 * 4) = uVar3;
                }
                auVar44 = (auVar44 | auVar13) ^ auVar12;
                iVar46 = auVar44._4_4_;
                if (iVar46 <= iVar15 && (iVar46 != iVar15 || auVar44._0_4_ <= auVar42._0_4_)) {
                  *(undefined4 *)(lVar20 + -4 + uVar34 * 4) = uVar3;
                  *(undefined4 *)(lVar20 + uVar34 * 4) = uVar3;
                }
                uVar34 = uVar34 + 4;
              } while ((uVar39 + 3 & 0xfffffffc) != uVar34);
            }
            uVar31 = uVar31 + 1;
            lVar20 = lVar20 + sVar5 * sVar6;
          } while (uVar31 != _c);
        }
      }
      else {
        local_d8 = (int *)CONCAT44(local_d8._4_4_,_c);
        if (local_e8->resize_type == 1) {
          if (local_e8->output_height == 0) {
            fVar41 = 1.0 / local_e8->height_scale;
          }
          else {
            fVar41 = (float)(int)local_b0 / (float)local_e8->output_height;
          }
          if (local_e8->output_width == 0) {
            fVar43 = 1.0 / local_e8->width_scale;
          }
          else {
            fVar43 = (float)(int)local_c8 / (float)local_e8->output_width;
          }
          if (0 < (int)_c) {
            local_c0 = (float *)bottom_blob->data;
            sVar5 = bottom_blob->cstep;
            sVar6 = bottom_blob->elemsize;
            pvVar26 = top_blob->data;
            sVar7 = top_blob->cstep;
            sVar8 = top_blob->elemsize;
            uVar31 = 0;
            do {
              if (0 < (int)uVar37) {
                puVar24 = (undefined4 *)(sVar7 * sVar8 * uVar31 + (long)pvVar26);
                uVar25 = 0;
                do {
                  if (0 < (int)uVar39) {
                    iVar15 = (int)((float)(int)uVar25 * fVar41);
                    if ((int)local_b0 + -1 < (int)((float)(int)uVar25 * fVar41)) {
                      iVar15 = (int)local_b0 + -1;
                    }
                    uVar35 = 0;
                    do {
                      iVar46 = (int)local_c8 + -1;
                      if ((int)((float)(int)uVar35 * fVar43) <= (int)local_c8 + -1) {
                        iVar46 = (int)((float)(int)uVar35 * fVar43);
                      }
                      *puVar24 = *(undefined4 *)
                                  ((long)local_c0 +
                                  (long)(iVar46 + iVar15 * (int)local_c8) * 4 +
                                  sVar5 * sVar6 * uVar31);
                      puVar24 = puVar24 + 1;
                      uVar35 = uVar35 + 1;
                    } while (uVar39 != uVar35);
                  }
                  uVar25 = uVar25 + 1;
                } while (uVar25 != uVar37);
              }
              uVar31 = uVar31 + 1;
            } while (uVar31 != _c);
          }
        }
        piVar36 = (int *)(long)(int)uVar39;
        piVar21 = (int *)(long)(int)uVar37;
        local_b8 = piVar36;
        local_58 = (ulong)uVar37;
        local_50 = bottom_blob;
        local_48 = top_blob;
        if (local_e8->resize_type == 2) {
          iVar15 = uVar39 * 3 + uVar37 * 3;
          uVar31 = 0xffffffffffffffff;
          if (-1 < iVar15) {
            uVar31 = (long)iVar15 * 4;
          }
          xofs = (int *)operator_new__(uVar31);
          piVar36 = xofs + (long)piVar36;
          pfVar27 = (float *)(piVar36 + (long)piVar21);
          local_a8 = piVar21;
          linear_coeffs((int)local_c8,uVar39,xofs,pfVar27);
          local_a0 = pfVar27 + (int)(uVar39 * 2);
          linear_coeffs((int)local_b0,uVar37,piVar36,pfVar27 + (int)(uVar39 * 2));
          piVar18 = local_a8;
          piVar21 = local_b8;
          if (0 < (int)local_d8) {
            local_98 = (Interp *)((ulong)local_d8 & 0xffffffff);
            pIVar22 = (Interp *)0x0;
            local_88 = piVar36;
            do {
              local_100 = (int *)CONCAT44(local_100._4_4_,local_50->w);
              local_68 = local_50->elemsize;
              local_80 = (void *)(local_50->cstep * (long)pIVar22 * local_68 + (long)local_50->data)
              ;
              local_70 = (int *)(long)local_48->w;
              local_60 = (undefined1 *)(ulong)(uint)local_48->h;
              pvVar26 = local_48->data;
              local_c0 = (float *)local_48->elemsize;
              pIVar23 = (Interp *)local_48->cstep;
              local_e0 = pIVar22;
              if (local_70 == (int *)0x0) {
                local_d0 = (Interp *)0x0;
                local_f0 = (Interp *)0x0;
                local_78 = (int *)0x0;
                local_f8 = (Interp *)0x0;
              }
              else {
                local_f8 = (Interp *)((long)local_70 * 4 + 4);
                local_108 = (Interp *)0x0;
                local_90 = pIVar23;
                iVar15 = posix_memalign(&local_108,0x10,(size_t)local_f8);
                if (iVar15 != 0) {
                  local_108 = (Interp *)0x0;
                }
                lVar20 = (long)local_70 * 4;
                local_f0 = local_108;
                *(undefined4 *)((long)&(local_108->super_Layer)._vptr_Layer + lVar20) = 1;
                local_108 = (Interp *)0x0;
                iVar15 = posix_memalign(&local_108,0x10,(size_t)local_f8);
                if (iVar15 != 0) {
                  local_108 = (Interp *)0x0;
                }
                local_d0 = (Interp *)((long)&(local_f0->super_Layer)._vptr_Layer + lVar20);
                local_78 = (int *)((long)&(local_108->super_Layer)._vptr_Layer + lVar20);
                local_f8 = local_108;
                *(undefined4 *)((long)&(local_108->super_Layer)._vptr_Layer + lVar20) = 1;
                pIVar23 = local_90;
              }
              if (0 < (int)local_60) {
                lVar20 = (long)pIVar23 * (long)local_c0;
                local_c0 = (float *)((long)local_c0 * (long)local_70);
                pvVar26 = (void *)((long)pvVar26 + lVar20 * (long)local_e0);
                lVar20 = 0;
                pfVar27 = local_a0;
                pIVar22 = local_f0;
                pIVar23 = local_f8;
                iVar15 = -2;
                do {
                  iVar46 = piVar36[lVar20];
                  iVar16 = (int)local_70;
                  pIVar30 = pIVar22;
                  if (iVar46 != iVar15) {
                    if (iVar46 == iVar15 + 1) {
                      pIVar30 = pIVar23;
                      pIVar23 = pIVar22;
                      if (0 < iVar16) {
                        uVar31 = 0;
                        do {
                          uVar4 = *(undefined8 *)
                                   ((long)local_80 +
                                   (long)xofs[uVar31] * 4 +
                                   (long)((iVar46 + 1) * (int)local_100) * local_68);
                          *(float *)((long)&(pIVar22->super_Layer)._vptr_Layer + uVar31 * 4) =
                               (float)((ulong)uVar4 >> 0x20) *
                               (float)((ulong)*(undefined8 *)
                                               (xofs + (long)piVar21 + (long)piVar18 + uVar31 * 2)
                                      >> 0x20) +
                               (float)uVar4 *
                               (float)*(undefined8 *)
                                       (xofs + (long)piVar21 + (long)piVar18 + uVar31 * 2);
                          uVar31 = uVar31 + 1;
                        } while (((ulong)local_70 & 0xffffffff) != uVar31);
                      }
                    }
                    else if (0 < iVar16) {
                      uVar31 = 0;
                      do {
                        iVar15 = xofs[uVar31];
                        uVar4 = *(undefined8 *)
                                 ((long)local_80 +
                                 (long)iVar15 * 4 + (long)(iVar46 * (int)local_100) * local_68);
                        fVar41 = (float)*(undefined8 *)
                                         (xofs + (long)piVar21 + (long)piVar18 + uVar31 * 2);
                        fVar43 = (float)((ulong)*(undefined8 *)
                                                 (xofs + (long)piVar21 + (long)piVar18 + uVar31 * 2)
                                        >> 0x20);
                        *(float *)((long)&(pIVar22->super_Layer)._vptr_Layer + uVar31 * 4) =
                             (float)((ulong)uVar4 >> 0x20) * fVar43 + (float)uVar4 * fVar41;
                        uVar4 = *(undefined8 *)
                                 ((long)local_80 +
                                 (long)iVar15 * 4 + (long)((iVar46 + 1) * (int)local_100) * local_68
                                 );
                        *(float *)((long)&(pIVar23->super_Layer)._vptr_Layer + uVar31 * 4) =
                             (float)((ulong)uVar4 >> 0x20) * fVar43 + (float)uVar4 * fVar41;
                        uVar31 = uVar31 + 1;
                        piVar36 = local_88;
                      } while (((ulong)local_70 & 0xffffffff) != uVar31);
                    }
                  }
                  if (0 < iVar16) {
                    fVar41 = *pfVar27;
                    fVar43 = pfVar27[1];
                    lVar17 = 0;
                    do {
                      *(float *)((long)pvVar26 + lVar17 * 4) =
                           *(float *)((long)&(pIVar23->super_Layer)._vptr_Layer + lVar17 * 4) *
                           fVar43 + *(float *)((long)&(pIVar30->super_Layer)._vptr_Layer +
                                              lVar17 * 4) * fVar41;
                      lVar17 = lVar17 + 1;
                    } while (iVar16 != (int)lVar17);
                  }
                  pfVar27 = pfVar27 + 2;
                  lVar20 = lVar20 + 1;
                  pvVar26 = (void *)((long)pvVar26 + (long)local_c0);
                  pIVar22 = pIVar30;
                  iVar15 = iVar46;
                } while ((undefined1 *)lVar20 != local_60);
              }
              if (local_78 != (int *)0x0) {
                LOCK();
                iVar15 = *local_78;
                *local_78 = *local_78 + -1;
                UNLOCK();
                if ((local_f8 != (Interp *)0x0) && (iVar15 == 1)) {
                  free(local_f8);
                }
              }
              if (local_d0 != (Interp *)0x0) {
                LOCK();
                iVar15 = *(int *)&(local_d0->super_Layer)._vptr_Layer;
                *(int *)&(local_d0->super_Layer)._vptr_Layer =
                     *(int *)&(local_d0->super_Layer)._vptr_Layer + -1;
                UNLOCK();
                if ((local_f0 != (Interp *)0x0) && (iVar15 == 1)) {
                  free(local_f0);
                }
              }
              pIVar22 = (Interp *)((long)&(local_e0->super_Layer)._vptr_Layer + 1);
            } while (pIVar22 != local_98);
          }
          operator_delete__(xofs);
          uVar37 = (uint)local_58;
          piVar21 = local_a8;
        }
        piVar36 = local_b8;
        if (local_e8->resize_type != 3) {
          return 0;
        }
        iVar15 = uVar39 * 5 + uVar37 * 5;
        uVar31 = 0xffffffffffffffff;
        if (-1 < iVar15) {
          uVar31 = (long)iVar15 * 4;
        }
        piVar18 = (int *)operator_new__(uVar31);
        piVar36 = piVar18 + (long)piVar36;
        pfVar27 = (float *)(piVar36 + (long)piVar21);
        local_70 = piVar36;
        cubic_coeffs((int)local_c8,uVar39,piVar18,pfVar27);
        local_40 = pfVar27 + (int)(uVar39 * 4);
        cubic_coeffs((int)local_b0,uVar37,piVar36,pfVar27 + (int)(uVar39 * 4));
        if (0 < (int)local_d8) {
          local_38 = (int *)((ulong)local_d8 & 0xffffffff);
          pfVar27 = (float *)(piVar18 + (long)piVar21 + (long)local_b8);
          piVar36 = (int *)0x0;
          local_100 = piVar18;
          local_a0 = pfVar27;
          do {
            iVar15 = local_50->w;
            local_88 = (int *)local_50->elemsize;
            local_f0 = (Interp *)
                       (local_50->cstep * (long)piVar36 * (long)local_88 + (long)local_50->data);
            local_e0 = (Interp *)(long)local_48->w;
            local_68 = (ulong)(uint)local_48->h;
            pvVar26 = local_48->data;
            local_80 = (void *)local_48->elemsize;
            sVar5 = local_48->cstep;
            local_f8 = (Interp *)CONCAT44(local_f8._4_4_,iVar15);
            local_78 = piVar36;
            if (local_e0 == (Interp *)0x0) {
              local_b0 = (int *)0x0;
              local_90 = (Interp *)0x0;
            }
            else {
              local_108 = (Interp *)0x0;
              iVar15 = posix_memalign(&local_108,0x10,(long)local_e0 * 4 + 4);
              if (iVar15 != 0) {
                local_108 = (Interp *)0x0;
              }
              local_b0 = (int *)((long)&(local_108->super_Layer)._vptr_Layer + (long)local_e0 * 4);
              local_90 = local_108;
              *(undefined4 *)((long)&(local_108->super_Layer)._vptr_Layer + (long)local_e0 * 4) = 1;
              piVar18 = local_100;
              iVar15 = (int)local_f8;
            }
            if ((int)local_e0 == 0) {
              local_d8 = (int *)0x0;
              local_98 = (Interp *)0x0;
              local_b8 = (int *)0x0;
              local_d0 = (Interp *)0x0;
              local_a8 = (int *)0x0;
              local_e8 = (Interp *)0x0;
            }
            else {
              __size = (long)local_e0 * 4 + 4;
              local_108 = (Interp *)0x0;
              iVar15 = posix_memalign(&local_108,0x10,__size);
              if (iVar15 != 0) {
                local_108 = (Interp *)0x0;
              }
              lVar20 = (long)local_e0 * 4;
              local_d8 = (int *)((long)&(local_108->super_Layer)._vptr_Layer + lVar20);
              local_98 = local_108;
              *(undefined4 *)((long)&(local_108->super_Layer)._vptr_Layer + (long)local_e0 * 4) = 1;
              if ((int)local_e0 == 0) {
                local_b8 = (int *)0x0;
                local_d0 = (Interp *)0x0;
                local_a8 = (int *)0x0;
                local_e8 = (Interp *)0x0;
              }
              else {
                local_108 = (Interp *)0x0;
                iVar15 = posix_memalign(&local_108,0x10,__size);
                if (iVar15 != 0) {
                  local_108 = (Interp *)0x0;
                }
                local_d0 = local_108;
                *(undefined4 *)((long)&(local_108->super_Layer)._vptr_Layer + lVar20) = 1;
                local_108 = (Interp *)0x0;
                iVar15 = posix_memalign(&local_108,0x10,__size);
                if (iVar15 != 0) {
                  local_108 = (Interp *)0x0;
                }
                local_b8 = (int *)((long)&(local_d0->super_Layer)._vptr_Layer + lVar20);
                local_a8 = (int *)((long)&(local_108->super_Layer)._vptr_Layer + lVar20);
                local_e8 = local_108;
                *(undefined4 *)((long)&(local_108->super_Layer)._vptr_Layer + lVar20) = 1;
              }
              piVar18 = local_100;
              iVar15 = (int)local_f8;
            }
            if (0 < (int)local_68) {
              local_f0 = (Interp *)&local_f0[-1].field_0xcc;
              lVar20 = ((ulong)local_e0 & 0xffffffff) * 4;
              pvVar26 = (void *)((long)pvVar26 + sVar5 * (long)local_80 * (long)local_78);
              local_80 = (void *)((long)local_80 * (long)local_e0);
              uVar34 = 0;
              local_c0 = local_40;
              uVar31 = 0xfffffffd;
              pIVar22 = local_98;
              pIVar23 = local_90;
              pIVar30 = local_e8;
              pIVar40 = local_d0;
              do {
                uVar39 = local_70[uVar34];
                local_58 = (ulong)uVar39;
                uVar37 = (uint)uVar31;
                iVar46 = (int)local_e0;
                pIVar19 = pIVar40;
                pIVar29 = pIVar30;
                pIVar32 = pIVar23;
                pIVar14 = pIVar22;
                if (uVar39 != uVar37) {
                  if (uVar39 == uVar37 + 1) {
                    pIVar19 = pIVar30;
                    pIVar29 = pIVar23;
                    pIVar32 = pIVar22;
                    pIVar14 = pIVar40;
                    if (0 < iVar46) {
                      lVar17 = 0;
                      do {
                        pfVar2 = pfVar27 + lVar17;
                        pfVar1 = (float *)((long)local_f0 +
                                          (long)*(int *)((long)piVar18 + lVar17) * 4 +
                                          (long)(int)((uVar39 + 2) * iVar15) * (long)local_88);
                        *(float *)((long)&(pIVar23->super_Layer)._vptr_Layer + lVar17) =
                             pfVar1[3] * pfVar2[3] + pfVar1[1] * pfVar2[1] +
                             pfVar1[2] * pfVar2[2] + *pfVar1 * *pfVar2;
                        lVar17 = lVar17 + 4;
                      } while (lVar20 - lVar17 != 0);
                    }
                  }
                  else if (uVar39 == uVar37 + 2) {
                    pIVar19 = pIVar23;
                    pIVar29 = pIVar22;
                    pIVar32 = pIVar40;
                    pIVar14 = pIVar30;
                    if (0 < iVar46) {
                      lVar17 = 0;
                      do {
                        iVar16 = *(int *)((long)piVar18 + lVar17);
                        pfVar1 = pfVar27 + lVar17;
                        fVar41 = *pfVar1;
                        fVar43 = pfVar1[1];
                        fVar9 = pfVar1[2];
                        fVar10 = pfVar1[3];
                        pfVar1 = (float *)((long)local_f0 +
                                          (long)iVar16 * 4 +
                                          (long)(int)((uVar39 + 1) * iVar15) * (long)local_88);
                        *(float *)((long)&(pIVar23->super_Layer)._vptr_Layer + lVar17) =
                             pfVar1[3] * fVar10 + pfVar1[1] * fVar43 +
                             pfVar1[2] * fVar9 + *pfVar1 * fVar41;
                        pfVar1 = (float *)((long)local_f0 +
                                          (long)iVar16 * 4 +
                                          (long)(int)((uVar39 + 2) * iVar15) * (long)local_88);
                        *(float *)((long)&(pIVar22->super_Layer)._vptr_Layer + lVar17) =
                             pfVar1[3] * fVar10 + pfVar1[1] * fVar43 +
                             pfVar1[2] * fVar9 + *pfVar1 * fVar41;
                        lVar17 = lVar17 + 4;
                      } while (lVar20 - lVar17 != 0);
                    }
                  }
                  else {
                    pfVar27 = local_a0;
                    if (uVar39 == uVar37 + 3) {
                      pIVar19 = pIVar22;
                      pIVar29 = pIVar40;
                      pIVar32 = pIVar30;
                      pIVar14 = pIVar23;
                      if (0 < iVar46) {
                        iVar16 = uVar39 * iVar15;
                        iVar28 = (uVar39 + 1) * iVar15;
                        iVar33 = (uVar39 + 2) * iVar15;
                        lVar17 = 0;
                        do {
                          lVar38 = (long)*(int *)((long)local_100 + lVar17);
                          pfVar1 = local_a0 + lVar17;
                          fVar41 = *pfVar1;
                          fVar43 = pfVar1[1];
                          fVar9 = pfVar1[2];
                          fVar10 = pfVar1[3];
                          pfVar1 = (float *)((long)local_f0 +
                                            lVar38 * 4 + (long)iVar16 * (long)local_88);
                          *(float *)((long)&(pIVar23->super_Layer)._vptr_Layer + lVar17) =
                               pfVar1[3] * fVar10 + pfVar1[1] * fVar43 +
                               pfVar1[2] * fVar9 + *pfVar1 * fVar41;
                          pfVar1 = (float *)((long)local_f0 +
                                            lVar38 * 4 + (long)iVar28 * (long)local_88);
                          *(float *)((long)&(pIVar22->super_Layer)._vptr_Layer + lVar17) =
                               pfVar1[3] * fVar10 + pfVar1[1] * fVar43 +
                               pfVar1[2] * fVar9 + *pfVar1 * fVar41;
                          pfVar1 = (float *)((long)local_f0 +
                                            lVar38 * 4 + (long)iVar33 * (long)local_88);
                          *(float *)((long)&(pIVar40->super_Layer)._vptr_Layer + lVar17) =
                               pfVar1[3] * fVar10 + pfVar1[1] * fVar43 +
                               pfVar1[2] * fVar9 + *pfVar1 * fVar41;
                          lVar17 = lVar17 + 4;
                          iVar15 = (int)local_f8;
                        } while (lVar20 - lVar17 != 0);
                      }
                    }
                    else if (0 < iVar46) {
                      iVar16 = (uVar39 + 1) * iVar15;
                      iVar28 = (uVar39 + 2) * iVar15;
                      local_c8 = (undefined1 *)
                                 ((long)local_f0 +
                                 (long)(int)((uVar39 - 1) * iVar15) * (long)local_88);
                      local_60 = (undefined1 *)
                                 ((long)local_f0 + (long)(int)(uVar39 * iVar15) * (long)local_88);
                      lVar17 = 0;
                      do {
                        lVar38 = (long)*(int *)((long)local_100 + lVar17);
                        pfVar1 = local_a0 + lVar17;
                        fVar41 = *pfVar1;
                        fVar43 = pfVar1[1];
                        fVar9 = pfVar1[2];
                        fVar10 = pfVar1[3];
                        pfVar1 = (float *)(local_c8 + lVar38 * 4);
                        *(float *)((long)&(pIVar23->super_Layer)._vptr_Layer + lVar17) =
                             pfVar1[3] * fVar10 + pfVar1[1] * fVar43 +
                             pfVar1[2] * fVar9 + *pfVar1 * fVar41;
                        pfVar1 = (float *)(local_60 + lVar38 * 4);
                        *(float *)((long)&(pIVar22->super_Layer)._vptr_Layer + lVar17) =
                             pfVar1[3] * fVar10 + pfVar1[1] * fVar43 +
                             pfVar1[2] * fVar9 + *pfVar1 * fVar41;
                        pfVar1 = (float *)((long)local_f0 +
                                          lVar38 * 4 + (long)iVar16 * (long)local_88);
                        *(float *)((long)&(pIVar40->super_Layer)._vptr_Layer + lVar17) =
                             pfVar1[3] * fVar10 + pfVar1[1] * fVar43 +
                             pfVar1[2] * fVar9 + *pfVar1 * fVar41;
                        pfVar1 = (float *)((long)local_f0 +
                                          lVar38 * 4 + (long)iVar28 * (long)local_88);
                        *(float *)((long)&(pIVar30->super_Layer)._vptr_Layer + lVar17) =
                             pfVar1[3] * fVar10 + pfVar1[1] * fVar43 +
                             pfVar1[2] * fVar9 + *pfVar1 * fVar41;
                        lVar17 = lVar17 + 4;
                        iVar15 = (int)local_f8;
                      } while (lVar20 - lVar17 != 0);
                    }
                  }
                }
                pIVar22 = pIVar14;
                if (0 < iVar46) {
                  fVar41 = *local_c0;
                  fVar43 = local_c0[1];
                  fVar9 = local_c0[2];
                  fVar10 = local_c0[3];
                  lVar17 = 0;
                  do {
                    *(float *)((long)pvVar26 + lVar17 * 4) =
                         *(float *)((long)&(pIVar29->super_Layer)._vptr_Layer + lVar17 * 4) * fVar10
                         + *(float *)((long)&(pIVar22->super_Layer)._vptr_Layer + lVar17 * 4) *
                           fVar43 +
                         *(float *)((long)&(pIVar19->super_Layer)._vptr_Layer + lVar17 * 4) * fVar9
                         + *(float *)((long)&(pIVar32->super_Layer)._vptr_Layer + lVar17 * 4) *
                           fVar41;
                    lVar17 = lVar17 + 1;
                  } while (iVar46 != (int)lVar17);
                }
                local_c0 = local_c0 + 4;
                uVar34 = uVar34 + 1;
                pvVar26 = (void *)((long)pvVar26 + (long)local_80);
                uVar31 = local_58;
                piVar18 = local_100;
                pIVar23 = pIVar32;
                pIVar30 = pIVar29;
                pIVar40 = pIVar19;
              } while (uVar34 != local_68);
            }
            if (local_a8 != (int *)0x0) {
              LOCK();
              iVar15 = *local_a8;
              *local_a8 = *local_a8 + -1;
              UNLOCK();
              if ((local_e8 != (Interp *)0x0) && (iVar15 == 1)) {
                free(local_e8);
                piVar18 = local_100;
              }
            }
            piVar36 = local_78;
            if (local_b8 != (int *)0x0) {
              LOCK();
              iVar15 = *local_b8;
              *local_b8 = *local_b8 + -1;
              UNLOCK();
              if ((local_d0 != (Interp *)0x0) && (iVar15 == 1)) {
                free(local_d0);
                piVar18 = local_100;
              }
            }
            if (local_d8 != (int *)0x0) {
              LOCK();
              iVar15 = *local_d8;
              *local_d8 = *local_d8 + -1;
              UNLOCK();
              if ((local_98 != (Interp *)0x0) && (iVar15 == 1)) {
                free(local_98);
                piVar18 = local_100;
              }
            }
            if (local_b0 != (int *)0x0) {
              LOCK();
              *local_b0 = *local_b0 + -1;
              UNLOCK();
              if (local_90 != (Interp *)0x0 && *local_b0 == 0) {
                free(local_90);
                piVar18 = local_100;
              }
            }
            piVar36 = (int *)((long)piVar36 + 1);
          } while (piVar36 != local_38);
        }
        operator_delete__(piVar18);
      }
      iVar15 = 0;
    }
  }
  return iVar15;
}

Assistant:

int Interp::forward(const Mat &bottom_blob, Mat &top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    int outh = output_height;
    int outw = output_width;
    if (bottom_blob.dims == 1)
    {
        h = 1;
        w = 1;
        channels = bottom_blob.w;
    }
    if (outh == 0 || outw == 0)
    {
        outh = static_cast<int>(h * height_scale);
        outw = static_cast<int>(w * width_scale);
    }
    if (outh == h && outw == w)
    {
        top_blob = bottom_blob;
        return 0;
    }

    top_blob.create(outw, outh, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (bottom_blob.dims == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            Mat top_blob_c = top_blob.channel(q);
            const float *ptr = ((const float*)bottom_blob.data + q);
            top_blob_c.fill(*ptr);
        }
        return 0;
    }

    if (resize_type == 1)// nearest
    {
        const float hs = output_height ? h / (float)output_height : 1.f / height_scale;
        const float ws = output_width ? w / (float)output_width : 1.f / width_scale;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);
            for (int y = 0; y < outh; y++)
            {
                int in_y = std::min((int) (y * hs), (h - 1));
                for (int x = 0; x < outw; x++)
                {
                    int in_x = std::min((int) (x * ws), (w - 1));
                    *outptr++ = ptr[in_y * w + in_x];
                }
            }
        }
    }

    if (resize_type == 2)// bilinear
    {
        int* buf = new int[outw + outh + outw*2 + outh*2];

        int* xofs = buf;//new int[outw];
        int* yofs = buf + outw;//new int[outh];

        float* alpha = (float*)(buf + outw + outh);//new float[outw * 2];
        float* beta = (float*)(buf + outw + outh + outw*2);//new float[outh * 2];

        linear_coeffs(w, outw, xofs, alpha);
        linear_coeffs(h, outh, yofs, beta);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; ++q)
        {
            const Mat src = bottom_blob.channel(q);
            Mat dst = top_blob.channel(q);

            resize_bilinear_image(src, dst, alpha, xofs, beta, yofs);
        }

        delete[] buf;
    }

    if (resize_type == 3)// bicubic
    {
        int* buf = new int[outw + outh + outw*4 + outh*4];

        int* xofs = buf;//new int[outw];
        int* yofs = buf + outw;//new int[outh];

        float* alpha = (float*)(buf + outw + outh);//new float[outw * 4];
        float* beta = (float*)(buf + outw + outh + outw*4);//new float[outh * 4];

        cubic_coeffs(w, outw, xofs, alpha);
        cubic_coeffs(h, outh, yofs, beta);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const Mat src = bottom_blob.channel(q);
            Mat dst = top_blob.channel(q);

            resize_bicubic_image(src, dst, alpha, xofs, beta, yofs);
        }

        delete[] buf;
    }

    return 0;
}